

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_appender<char>
fmt::v11::detail::write_int_noinline<char,fmt::v11::basic_appender<char>,unsigned_int>
          (basic_appender<char> out,write_int_arg<unsigned_int> arg,format_specs *specs)

{
  int iVar1;
  basic_appender<char> bVar2;
  char *begin;
  size_t sVar3;
  uint uVar4;
  char *pcVar5;
  write_int_arg<unsigned_int> wVar6;
  long lVar7;
  buffer<char> *buf;
  uint uVar8;
  write_int_arg<unsigned_int> wVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  char buffer [32];
  anon_class_24_4_0fb5e8cf local_60;
  char local_48 [31];
  byte local_29;
  
  begin = &stack0xffffffffffffffd8;
  uVar13 = (ulong)arg >> 0x20;
  uVar4 = (specs->super_basic_specs).data_;
  switch(uVar4 & 7) {
  case 4:
    pcVar5 = "0123456789ABCDEF";
    if ((uVar4 >> 0xc & 1) == 0) {
      pcVar5 = "0123456789abcdef";
    }
    wVar6 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
    wVar9 = arg;
    do {
      uVar8 = wVar9.abs_value;
      begin[-1] = pcVar5[uVar8 & 0xf];
      begin = begin + -1;
      wVar6 = (write_int_arg<unsigned_int>)((ulong)wVar6 >> 4);
      wVar9 = wVar6;
    } while (0xf < uVar8);
    if ((uVar4 >> 0xd & 1) == 0) goto LAB_0039a5db;
    uVar4 = (uint)((uVar4 >> 0xc & 1) == 0) << 0xd | 0x5830;
    break;
  case 5:
    lVar7 = 0;
    uVar10 = (ulong)arg & 0xffffffff;
    begin = &stack0xffffffffffffffd8;
    do {
      uVar8 = (uint)uVar10;
      begin[-1] = (byte)uVar10 & 7 | 0x30;
      begin = begin + -1;
      uVar10 = uVar10 >> 3;
      lVar7 = lVar7 + 1;
    } while (7 < uVar8);
    if (((uVar4 >> 0xd & 1) != 0) && (arg.abs_value != 0 && specs->precision <= lVar7)) {
      uVar4 = 0x3000;
      if (uVar13 == 0) {
        uVar4 = 0x30;
      }
      uVar13 = (ulong)((uVar4 | arg.prefix) + 0x1000000);
    }
    goto LAB_0039a5db;
  case 6:
    wVar6 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
    wVar9 = arg;
    begin = &stack0xffffffffffffffd8;
    do {
      uVar8 = wVar9.abs_value;
      begin[-1] = (byte)wVar9.abs_value & 1 | 0x30;
      begin = begin + -1;
      wVar6 = (write_int_arg<unsigned_int>)((ulong)wVar6 >> 1);
      wVar9 = wVar6;
    } while (1 < uVar8);
    if ((uVar4 >> 0xd & 1) == 0) goto LAB_0039a5db;
    uVar4 = (uint)((uVar4 >> 0xc & 1) == 0) << 0xd | 0x4230;
    break;
  case 7:
    local_60.prefix._0_2_ = CONCAT11((char)arg.abs_value,(uVar4 & 7) == 1);
    bVar2 = write_padded<char,(fmt::v11::align)1,fmt::v11::basic_appender<char>,fmt::v11::detail::write_char<char,fmt::v11::basic_appender<char>>(fmt::v11::basic_appender<char>,char,fmt::v11::format_specs_const&)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                      (out,specs,1,1,(anon_class_2_2_bf5026b7 *)&local_60);
    return (basic_appender<char>)bVar2.container;
  default:
    begin = do_format_decimal<char,unsigned_int>(local_48,arg.abs_value,0x20);
    goto LAB_0039a5db;
  }
  uVar8 = uVar4 << 8;
  if (uVar13 == 0) {
    uVar8 = uVar4;
  }
  uVar13 = (ulong)((uVar8 | arg.prefix) + 0x2000000);
LAB_0039a5db:
  iVar11 = (int)&stack0xffffffffffffffd8 - (int)begin;
  uVar8 = specs->width;
  iVar1 = specs->precision;
  uVar12 = (uint)uVar13;
  uVar4 = (uVar12 >> 0x18) + iVar11;
  if (iVar1 == -1 && uVar8 == 0) {
    uVar10 = (ulong)uVar4 + (out.container)->size_;
    if ((out.container)->capacity_ < uVar10) {
      (*(out.container)->grow_)(out.container,uVar10);
    }
    uVar4 = uVar12 & 0xffffff;
    if ((uVar13 & 0xffffff) != 0) {
      do {
        sVar3 = (out.container)->size_;
        uVar13 = sVar3 + 1;
        if ((out.container)->capacity_ < uVar13) {
          (*(out.container)->grow_)(out.container,uVar13);
          sVar3 = (out.container)->size_;
          uVar13 = sVar3 + 1;
        }
        (out.container)->size_ = uVar13;
        (out.container)->ptr_[sVar3] = (char)uVar4;
        bVar14 = 0xff < uVar4;
        uVar4 = uVar4 >> 8;
      } while (bVar14);
    }
    buffer<char>::append<char>(out.container,begin,&stack0xffffffffffffffd8);
  }
  else {
    if (((specs->super_basic_specs).data_ & 0x38) == 0x20) {
      local_60.padding = uVar8 - uVar4;
      if (uVar8 < uVar4) {
        local_60.padding = 0;
      }
      if (uVar8 >= uVar4 && uVar8 - uVar4 != 0) {
        uVar4 = uVar8;
      }
    }
    else {
      local_60.padding = 0;
      if (iVar1 - iVar11 != 0 && iVar11 <= iVar1) {
        local_60.padding = iVar1 - iVar11;
        uVar4 = iVar1 + (uVar12 >> 0x18);
      }
    }
    local_60.prefix = uVar12;
    local_60.begin = begin;
    local_60.end = &stack0xffffffffffffffd8;
    out = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_int<char,fmt::v11::basic_appender<char>,unsigned_int>(fmt::v11::basic_appender<char>,fmt::v11::detail::write_int_arg<unsigned_int>,fmt::v11::format_specs_const&)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                    (out,specs,(ulong)uVar4,(ulong)uVar4,&local_60);
  }
  return (basic_appender<char>)out.container;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(OutputIt out,
                                                   write_int_arg<T> arg,
                                                   const format_specs& specs)
    -> OutputIt {
  return write_int<Char>(out, arg, specs);
}